

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Items.cpp
# Opt level: O0

map<int,_std::shared_ptr<Item>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Item>_>_>_>
* __thiscall
Items::EnumerateItems
          (map<int,_std::shared_ptr<Item>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Item>_>_>_>
           *__return_storage_ptr__,Items *this)

{
  Items *this_local;
  
  memset(__return_storage_ptr__,0,0x30);
  std::
  map<int,_std::shared_ptr<Item>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Item>_>_>_>
  ::map(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::shared_ptr<Item>> Items::EnumerateItems() {
    return std::map<int, std::shared_ptr<Item>>();
}